

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

ON_3dVector * __thiscall ON_Line::Direction(ON_3dVector *__return_storage_ptr__,ON_Line *this)

{
  bool bVar1;
  ON_3dVector *local_30;
  ON_Line *this_local;
  
  if (((((this->to).x <= -1.23432101234321e+308) ||
       (1.23432101234321e+308 < (this->to).x || (this->to).x == 1.23432101234321e+308)) ||
      ((this->from).x <= -1.23432101234321e+308)) ||
     (1.23432101234321e+308 < (this->from).x || (this->from).x == 1.23432101234321e+308)) {
    bVar1 = ON_3dPoint::operator==(&ON_3dPoint::UnsetPoint,&this->from);
    if ((bVar1) && (bVar1 = ON_3dPoint::operator==(&ON_3dPoint::UnsetPoint,&this->to), bVar1)) {
      local_30 = &ON_3dVector::UnsetVector;
    }
    else {
      local_30 = &ON_3dVector::NanVector;
    }
    __return_storage_ptr__->x = local_30->x;
    __return_storage_ptr__->y = local_30->y;
    __return_storage_ptr__->z = local_30->z;
  }
  else {
    ON_3dPoint::operator-(__return_storage_ptr__,&this->to,&this->from);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_Line::Direction() const
{
  return (ON_UNSET_VALUE < to.x && to.x < ON_UNSET_POSITIVE_VALUE && ON_UNSET_VALUE <from.x && from.x < ON_UNSET_POSITIVE_VALUE) 
    ? (to-from)
    : (ON_3dPoint::UnsetPoint == from && ON_3dPoint::UnsetPoint == to ? ON_3dVector::UnsetVector : ON_3dVector::NanVector)
    ;
}